

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::ForceConstraintPS::ForceConstraintPS
          (ForceConstraintPS *this,SPxLPBase<double> *lp,int _i,bool lhsFixed,
          DataArray<bool> *fixCols,Array<double> *lo,Array<double> *up,
          shared_ptr<soplex::Tolerances> *tols)

{
  int iVar1;
  SPxSense SVar2;
  double *pdVar3;
  SVectorBase<double> *pSVar4;
  byte in_CL;
  undefined4 in_EDX;
  int __c;
  int __c_00;
  SPxLPBase<double> *in_RSI;
  undefined8 *in_RDI;
  double dVar5;
  int k;
  DSVectorBase<double> *in_stack_fffffffffffffec8;
  int n;
  SPxLPBase<double> *in_stack_fffffffffffffed0;
  SPxLPBase<double> *in_stack_fffffffffffffed8;
  int i;
  SPxLPBase<double> *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  PostStep *in_stack_fffffffffffffef0;
  SPxLPBase<double> *local_108;
  double local_88;
  uint local_48;
  
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffffed0,
             (shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffffec8);
  SPxLPBase<double>::nRows((SPxLPBase<double> *)0x282b66);
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x282b7c);
  PostStep::PostStep(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                     (shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffffee0,
                     (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8)
  ;
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x282bc5);
  *in_RDI = &PTR__ForceConstraintPS_008976d0;
  *(undefined4 *)(in_RDI + 5) = in_EDX;
  iVar1 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x282bfa);
  *(int *)((long)in_RDI + 0x2c) = iVar1 + -1;
  iVar1 = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  if ((in_CL & 1) == 0) {
    pdVar3 = SPxLPBase<double>::rhs(in_stack_fffffffffffffed0,iVar1);
    local_88 = *pdVar3;
  }
  else {
    pdVar3 = SPxLPBase<double>::lhs(in_stack_fffffffffffffed0,iVar1);
    local_88 = *pdVar3;
  }
  in_RDI[6] = local_88;
  SPxLPBase<double>::rowVector
            (in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
  DSVectorBase<double>::DSVectorBase<double>
            ((DSVectorBase<double> *)in_stack_fffffffffffffed0,
             (SVectorBase<double> *)in_stack_fffffffffffffec8);
  pSVar4 = SPxLPBase<double>::rowVector
                     (in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
  SVectorBase<double>::size(pSVar4);
  Array<double>::Array
            ((Array<double> *)in_stack_fffffffffffffee0,
             (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
  DataArray<bool>::DataArray
            ((DataArray<bool> *)in_stack_fffffffffffffee0,
             (DataArray<bool> *)in_stack_fffffffffffffed8);
  pSVar4 = SPxLPBase<double>::rowVector
                     (in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
  SVectorBase<double>::size(pSVar4);
  Array<soplex::DSVectorBase<double>_>::Array
            ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffffee0,
             (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
  *(byte *)(in_RDI + 0x14) = in_CL & 1;
  SVar2 = SPxLPBase<double>::spxSense(in_RSI);
  *(bool *)((long)in_RDI + 0xa1) = SVar2 == MAXIMIZE;
  Array<double>::Array
            ((Array<double> *)in_stack_fffffffffffffee0,(Array<double> *)in_stack_fffffffffffffed8);
  Array<double>::Array
            ((Array<double> *)in_stack_fffffffffffffee0,(Array<double> *)in_stack_fffffffffffffed8);
  pdVar3 = SPxLPBase<double>::lhs
                     (in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
  in_RDI[0x1b] = *pdVar3;
  pdVar3 = SPxLPBase<double>::rhs
                     (in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
  in_RDI[0x1c] = *pdVar3;
  dVar5 = SPxLPBase<double>::rowObj
                    (in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
  in_RDI[0x1d] = dVar5;
  local_48 = 0;
  while( true ) {
    n = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
    i = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
    iVar1 = SVectorBase<double>::size((SVectorBase<double> *)(in_RDI + 8));
    if (iVar1 <= (int)local_48) break;
    SVar2 = SPxLPBase<double>::spxSense(in_RSI);
    if (SVar2 == MINIMIZE) {
      SVectorBase<double>::index((SVectorBase<double> *)(in_RDI + 8),(char *)(ulong)local_48,__c);
      local_108 = (SPxLPBase<double> *)SPxLPBase<double>::obj(in_stack_fffffffffffffee0,i);
    }
    else {
      SVectorBase<double>::index((SVectorBase<double> *)(in_RDI + 8),(char *)(ulong)local_48,__c);
      dVar5 = SPxLPBase<double>::obj(in_stack_fffffffffffffee0,i);
      local_108 = (SPxLPBase<double> *)((ulong)dVar5 ^ 0x8000000000000000);
    }
    pdVar3 = Array<double>::operator[]((Array<double> *)local_108,n);
    *pdVar3 = (double)local_108;
    in_stack_fffffffffffffed8 = in_RSI;
    SVectorBase<double>::index((SVectorBase<double> *)(in_RDI + 8),(char *)(ulong)local_48,__c_00);
    in_stack_fffffffffffffee0 = (SPxLPBase<double> *)SPxLPBase<double>::colVector(local_108,n);
    in_stack_fffffffffffffec8 =
         Array<soplex::DSVectorBase<double>_>::operator[]
                   ((Array<soplex::DSVectorBase<double>_> *)local_108,n);
    DSVectorBase<double>::operator=
              ((DSVectorBase<double> *)local_108,(SVectorBase<double> *)in_stack_fffffffffffffec8);
    local_48 = local_48 + 1;
  }
  return;
}

Assistant:

ForceConstraintPS(const SPxLPBase<R>& lp, int _i, bool lhsFixed,
                        DataArray<bool>& fixCols,
                        Array<R>& lo, Array<R>& up, std::shared_ptr<Tolerances> tols)
         : PostStep("ForceConstraint", tols, lp.nRows(), lp.nCols())
         , m_i(_i)
         , m_old_i(lp.nRows() - 1)
         , m_lRhs(lhsFixed ? lp.lhs(_i) : lp.rhs(_i))
         , m_row(lp.rowVector(_i))
         , m_objs(lp.rowVector(_i).size())
         , m_fixed(fixCols)
         , m_cols(lp.rowVector(_i).size())
         , m_lhsFixed(lhsFixed)
         , m_maxSense(lp.spxSense() == SPxLPBase<R>::MAXIMIZE)
         , m_oldLowers(lo)
         , m_oldUppers(up)
         , m_lhs(lp.lhs(_i))
         , m_rhs(lp.rhs(_i))
         , m_rowobj(lp.rowObj(_i))
      {
         for(int k = 0; k < m_row.size(); ++k)
         {
            m_objs[k] = (lp.spxSense() == SPxLPBase<R>::MINIMIZE ? lp.obj(m_row.index(k)) : -lp.obj(m_row.index(
                            k)));
            m_cols[k] = lp.colVector(m_row.index(k));
         }
      }